

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  Ch *pCVar1;
  BaseState<false> *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  
  pCVar1 = is->src_;
  is->src_ = pCVar1 + 1;
  if (((pCVar1[1] == 'r') && (is->src_ = pCVar1 + 2, pCVar1[2] == 'u')) &&
     (is->src_ = pCVar1 + 3, pCVar1[3] == 'e')) {
    is->src_ = pCVar1 + 4;
    pBVar2 = (handler->ctx).current_state;
    iVar3 = (*pBVar2->_vptr_BaseState[1])(pBVar2,handler,1);
    if ((BaseState<false> *)CONCAT44(extraout_var,iVar3) != (BaseState<false> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var,iVar3);
      return;
    }
    lVar4 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
  }
  else {
    lVar4 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
  }
  *(long *)(this + 0x38) = lVar4;
  return;
}

Assistant:

void ParseTrue(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == 't');
    is.Take();

    if (RAPIDJSON_LIKELY(Consume(is, 'r') && Consume(is, 'u') && Consume(is, 'e')))
    { if (RAPIDJSON_UNLIKELY(!handler.Bool(true)))
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
  }